

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<double,double,duckdb::UnaryOperatorWrapper,duckdb::NoInfiniteDoubleWrapper<duckdb::SinOperator>>
               (double *ldata,double *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  idx_t iVar1;
  ulong uVar2;
  idx_t i;
  idx_t row_idx;
  ulong uVar3;
  double dVar4;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = uVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)sel_vector->sel_vector[uVar3];
      }
      dVar4 = NoInfiniteDoubleWrapper<duckdb::SinOperator>::Operation<double,double>(ldata[uVar2]);
      result_data[uVar3] = dVar4;
    }
  }
  else {
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      iVar1 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[row_idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar1 >> 6] >>
           (iVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      else {
        dVar4 = NoInfiniteDoubleWrapper<duckdb::SinOperator>::Operation<double,double>(ldata[iVar1])
        ;
        result_data[row_idx] = dVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}